

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  lzma_ret ret_00;
  uint32_t uVar1;
  int iVar2;
  void *pvVar3;
  bool bVar4;
  long lStack_38;
  int ret;
  ssize_t avail_in;
  size_t decompressed;
  private_data_conflict2 *state;
  void **p_local;
  archive_read_filter *self_local;
  
  decompressed = (size_t)self->data;
  *(undefined8 *)(decompressed + 0x18) = *(undefined8 *)(decompressed + 0x88);
  *(undefined8 *)(decompressed + 0x20) = *(undefined8 *)(decompressed + 0x90);
  state = (private_data_conflict2 *)p;
  p_local = (void **)self;
  while( true ) {
    bVar4 = false;
    if (*(long *)(decompressed + 0x20) != 0) {
      bVar4 = *(char *)(decompressed + 0xa0) == '\0';
    }
    if (!bVar4) {
      avail_in = *(long *)(decompressed + 0x18) - *(long *)(decompressed + 0x88);
      *(ssize_t *)(decompressed + 0x98) = avail_in + *(long *)(decompressed + 0x98);
      *(ssize_t *)(decompressed + 0xb0) = avail_in + *(long *)(decompressed + 0xb0);
      if (avail_in == 0) {
        (state->stream).next_in = (uint8_t *)0x0;
      }
      else {
        (state->stream).next_in = *(uint8_t **)(decompressed + 0x88);
        if (*(int *)(p_local + 0xc) == 9) {
          uVar1 = lzma_crc32(*(uint8_t **)(decompressed + 0x88),avail_in,
                             *(uint32_t *)(decompressed + 0xa4));
          *(uint32_t *)(decompressed + 0xa4) = uVar1;
          if ((*(char *)(decompressed + 0xa0) != '\0') &&
             (iVar2 = lzip_tail((archive_read_filter *)p_local), iVar2 != 0)) {
            return (long)iVar2;
          }
        }
      }
      return avail_in;
    }
    if (*(char *)(decompressed + 0xa1) == '\0') {
      iVar2 = lzip_init((archive_read_filter *)p_local);
      if (iVar2 != 0) {
        return (long)iVar2;
      }
      *(undefined1 *)(decompressed + 0xa1) = 1;
    }
    pvVar3 = __archive_read_filter_ahead
                       ((archive_read_filter *)p_local[2],1,&stack0xffffffffffffffc8);
    *(void **)decompressed = pvVar3;
    if ((*(long *)decompressed == 0) && (lStack_38 < 0)) break;
    *(long *)(decompressed + 8) = lStack_38;
    bVar4 = *(long *)(decompressed + 8) == 0;
    ret_00 = lzma_code((lzma_stream *)decompressed,(uint)bVar4 + (uint)bVar4 * 2);
    if (ret_00 != LZMA_OK) {
      if (ret_00 != LZMA_STREAM_END) {
        set_error((archive_read_filter *)p_local,ret_00);
        return -0x1e;
      }
      *(undefined1 *)(decompressed + 0xa0) = 1;
    }
    __archive_read_filter_consume
              ((archive_read_filter *)p_local[2],lStack_38 - *(long *)(decompressed + 8));
    *(long *)(decompressed + 0xa8) =
         (lStack_38 - *(long *)(decompressed + 8)) + *(long *)(decompressed + 0xa8);
  }
  archive_set_error((archive *)p_local[3],-1,"truncated input");
  return -0x1e;
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}